

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O3

Fluid_Image * Fluid_Image::find(char *iname)

{
  int iVar1;
  Fluid_Image **ppFVar2;
  int iVar3;
  FILE *__stream;
  Fluid_Image *pFVar4;
  char *pcVar5;
  Fl_Shared_Image *pFVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  
  ppFVar2 = images;
  if ((iname != (char *)0x0) && (uVar12 = 0, *iname != '\0')) {
    if (0 < numimages) {
      uVar12 = 0;
      uVar9 = numimages;
      do {
        uVar8 = uVar12 + uVar9 >> 1;
        pFVar4 = ppFVar2[uVar8];
        iVar3 = strcmp(iname,pFVar4->name_);
        if (-1 < iVar3) {
          if (iVar3 == 0) {
            return pFVar4;
          }
          uVar12 = uVar8 + 1;
          uVar8 = uVar9;
        }
        uVar9 = uVar8;
      } while ((int)uVar12 < (int)uVar9);
    }
    goto_source_dir();
    __stream = (FILE *)fl_fopen(iname,"rb");
    if (__stream == (FILE *)0x0) {
      piVar7 = __errno_location();
      pcVar5 = strerror(*piVar7);
      read_error("%s : %s",iname,pcVar5);
    }
    else {
      fclose(__stream);
      pFVar4 = (Fluid_Image *)operator_new(0x28);
      pcVar5 = strdup(iname);
      pFVar4->name_ = pcVar5;
      pFVar4->written = 0;
      pFVar4->refcount = 0;
      pFVar6 = Fl_Shared_Image::get(iname,0,0);
      pFVar4->img = pFVar6;
      pFVar4->function_name_ = (char *)0x0;
      if (((pFVar6 != (Fl_Shared_Image *)0x0) && ((pFVar6->super_Fl_Image).w_ != 0)) &&
         ((pFVar6->super_Fl_Image).h_ != 0)) {
        leave_source_dir();
        iVar3 = numimages;
        lVar11 = (long)numimages;
        iVar10 = numimages + 1;
        bVar13 = tablesize <= numimages;
        numimages = iVar10;
        if (bVar13) {
          iVar1 = tablesize * 2;
          bVar13 = tablesize != 0;
          tablesize = 0x10;
          if (bVar13) {
            tablesize = iVar1;
          }
          if (images == (Fluid_Image **)0x0) {
            images = (Fluid_Image **)malloc((long)tablesize << 3);
          }
          else {
            images = (Fluid_Image **)realloc(images,(long)tablesize << 3);
          }
        }
        ppFVar2 = images;
        if ((int)uVar12 < iVar3) {
          do {
            ppFVar2[lVar11] = ppFVar2[(long)iVar10 + -2];
            lVar11 = lVar11 + -1;
            iVar10 = iVar10 + -1;
          } while ((long)(ulong)uVar12 < lVar11);
        }
        ppFVar2[uVar12] = pFVar4;
        return pFVar4;
      }
      ~Fluid_Image(pFVar4);
      operator_delete(pFVar4,0x28);
      read_error("%s : unrecognized image format",iname);
    }
    leave_source_dir();
  }
  return (Fluid_Image *)0x0;
}

Assistant:

Fluid_Image* Fluid_Image::find(const char *iname) {
  if (!iname || !*iname) return 0;

  // first search to see if it exists already:
  int a = 0;
  int b = numimages;
  while (a < b) {
    int c = (a+b)/2;
    int i = strcmp(iname,images[c]->name_);
    if (i < 0) b = c;
    else if (i > 0) a = c+1;
    else return images[c];
  }

  // no, so now see if the file exists:

  goto_source_dir();
  FILE *f = fl_fopen(iname,"rb");
  if (!f) {
    read_error("%s : %s",iname,strerror(errno));
    leave_source_dir();
    return 0;
  }
  fclose(f);

  Fluid_Image *ret = new Fluid_Image(iname);

  if (!ret->img || !ret->img->w() || !ret->img->h()) {
    delete ret;
    ret = 0;
    read_error("%s : unrecognized image format", iname);
  }
  leave_source_dir();
  if (!ret) return 0;

  // make a new entry in the table:
  numimages++;
  if (numimages > tablesize) {
    tablesize = tablesize ? 2*tablesize : 16;
    if (images) images = (Fluid_Image**)realloc(images, tablesize*sizeof(Fluid_Image*));
    else images = (Fluid_Image**)malloc(tablesize*sizeof(Fluid_Image*));
  }
  for (b = numimages-1; b > a; b--) images[b] = images[b-1];
  images[a] = ret;

  return ret;
}